

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printMessage(ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  Column *col;
  ostream *poVar3;
  Column local_60;
  reference local_30;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ConsoleAssertionPrinter *this_local;
  
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty(&this->messageLabel);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)this->stream,(string *)&this->messageLabel);
    poVar2 = std::operator<<(poVar2,':');
    std::operator<<(poVar2,'\n');
  }
  __end2 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                     (&this->messages);
  msg = (MessageInfo *)
        clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                  (&this->messages);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                *)&msg);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator*(&__end2);
    if (((this->printInfoMessages & 1U) != 0) || (local_30->type != Info)) {
      poVar3 = this->stream;
      clara::TextFlow::Column::Column(&local_60,&local_30->message);
      col = clara::TextFlow::Column::indent(&local_60,2);
      poVar3 = clara::TextFlow::operator<<(poVar3,col);
      std::operator<<((ostream *)poVar3,'\n');
      clara::TextFlow::Column::~Column(&local_60);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printMessage() const {
        if (!messageLabel.empty())
            stream << messageLabel << ':' << '\n';
        for (auto const& msg : messages) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || msg.type != ResultWas::Info)
                stream << Column(msg.message).indent(2) << '\n';
        }
    }